

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

uint __thiscall Parser::CalculateFunctionColumnNumber(Parser *this)

{
  charcount_t cVar1;
  charcount_t cVar2;
  ULONG UVar3;
  Scanner_t *pSVar4;
  ULONG offsetFromCurrentFunction;
  charcount_t ichMinLine;
  charcount_t ichMinTok;
  uint columnNumber;
  Parser *this_local;
  
  pSVar4 = GetScanner(this);
  cVar1 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar4);
  pSVar4 = GetScanner(this);
  cVar2 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinLine(pSVar4);
  if (cVar1 < cVar2) {
    if (this->m_currentNodeFunc == (ParseNodeFnc *)0x0) {
      ichMinLine = 0;
    }
    else {
      ichMinLine = this->m_currentNodeFunc->columnNumber +
                   (cVar1 - (this->m_currentNodeFunc->super_ParseNode).ichMin);
    }
  }
  else {
    ichMinLine = cVar1 - cVar2;
    if (this->m_functionBody != (ParseableFunctionInfo *)0x0) {
      UVar3 = Js::ParseableFunctionInfo::GetRelativeLineNumber(this->m_functionBody);
      pSVar4 = GetScanner(this);
      cVar1 = Scanner<UTF8EncodingPolicyBase<false>_>::LineCur(pSVar4);
      if (UVar3 == cVar1) {
        UVar3 = Js::ParseableFunctionInfo::GetRelativeColumnNumber(this->m_functionBody);
        ichMinLine = UVar3 + ichMinLine;
      }
    }
  }
  return ichMinLine;
}

Assistant:

uint Parser::CalculateFunctionColumnNumber()
{
    uint columnNumber;

    charcount_t ichMinTok = this->GetScanner()->IchMinTok();
    charcount_t ichMinLine = this->GetScanner()->IchMinLine();
    if (ichMinTok >= ichMinLine)
    {
        // In scenarios involving defer parse IchMinLine() can be incorrect for the first line after defer parse
        columnNumber = ichMinTok - ichMinLine;
        if (m_functionBody != nullptr && m_functionBody->GetRelativeLineNumber() == this->GetScanner()->LineCur())
        {
            // Adjust the column if it falls on the first line, where the re-parse is happening.
            columnNumber += m_functionBody->GetRelativeColumnNumber();
        }
    }
    else if (m_currentNodeFunc)
    {
        // For the first line after defer parse, compute the column relative to the column number
        // of the lexically parent function.
        ULONG offsetFromCurrentFunction = ichMinTok - m_currentNodeFunc->ichMin;
        columnNumber = m_currentNodeFunc->columnNumber + offsetFromCurrentFunction;
    }
    else
    {
        // if there is no current function, lets give a default of 0.
        columnNumber = 0;
    }

    return columnNumber;
}